

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmath.c
# Opt level: O0

void print_binary(uint64_t number)

{
  int local_6c;
  undefined1 local_68 [4];
  int i;
  char buff [73];
  ulong local_10;
  uint64_t number_local;
  
  memset(local_68,0,0x49);
  memset(local_68,0x30,0x48);
  buff[0] = ' ';
  buff[9] = ' ';
  buff[0x12] = ' ';
  buff[0x1b] = '\n';
  buff[0x24] = ' ';
  buff[0x2d] = ' ';
  buff[0x36] = ' ';
  buff[0x3f] = '\n';
  local_6c = 2;
  for (local_10 = number; local_10 != 0; local_10 = local_10 >> 1) {
    local_6c = (uint)(buff[0x41 - (long)local_6c] != '0') + local_6c;
    buff[0x41 - (long)local_6c] = ((byte)local_10 & 1) + 0x30;
    local_6c = local_6c + 1;
  }
  fwrite(local_68,0x49,1,stdout);
  return;
}

Assistant:

static void print_binary(uint64_t number)
{
	// (bytes * bits per byte) + 2 newlines + 6 spaces + 1 null
	char buff[(sizeof(number) * 8) + 8 + 1] = { 0 };
	memset(buff, '0', sizeof(buff) - 1);

	// Print table can be pre-allocated
	buff[8] = ' ';
	buff[16 + 1] = ' ';
	buff[24 + 2] = ' ';
	buff[32 + 3] = '\n';
	buff[40 + 4] = ' ';
	buff[48 + 5] = ' ';
	buff[56 + 6] = ' ';
	buff[64 + 7] = '\n';

	int i = 2;
	while (number) {
		i += buff[sizeof(buff) - i] != '0';
		buff[sizeof(buff) - i] = (number & 0x1) + '0';
		number >>= 1;
		i++;
	}

	fwrite(buff, sizeof(buff), 1, stdout);
}